

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func_test.cpp
# Opt level: O0

void ultimateTest(void)

{
  System *pSVar1;
  System *pSVar2;
  double dVar3;
  allocator local_1f9;
  string local_1f8 [39];
  allocator local_1d1;
  string local_1d0 [39];
  allocator local_1a9;
  string local_1a8 [39];
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [32];
  System *local_e8;
  System *q5;
  string local_d8 [32];
  System *local_b8;
  System *q4;
  string local_a8 [32];
  System *local_88;
  System *q3;
  string local_78 [32];
  System *local_58;
  System *q2;
  allocator local_39;
  string local_38 [32];
  System *local_18;
  System *q1;
  Model *m;
  
  pSVar1 = (System *)Model::createModel();
  q1 = pSVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"sys1",&local_39);
  pSVar2 = (System *)(**(code **)(*(long *)pSVar1 + 0x50))(0,pSVar1,local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  pSVar1 = q1;
  local_18 = pSVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"sys2",(allocator *)((long)&q3 + 7));
  pSVar2 = (System *)(**(code **)(*(long *)pSVar1 + 0x50))(0,pSVar1,local_78);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)((long)&q3 + 7));
  pSVar1 = q1;
  local_58 = pSVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"sys3",(allocator *)((long)&q4 + 7));
  pSVar2 = (System *)(**(code **)(*(long *)pSVar1 + 0x50))(0,pSVar1,local_a8);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&q4 + 7));
  pSVar1 = q1;
  local_88 = pSVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"sys4",(allocator *)((long)&q5 + 7));
  pSVar2 = (System *)(**(code **)(*(long *)pSVar1 + 0x50))(0,pSVar1,local_d8);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&q5 + 7));
  pSVar1 = q1;
  local_b8 = pSVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"sys5",&local_109);
  pSVar2 = (System *)(**(code **)(*(long *)pSVar1 + 0x50))(0,pSVar1,local_108);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  pSVar1 = q1;
  local_e8 = pSVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"exp1",&local_131);
  Model::createFlow<FlowExp>((Model *)pSVar1,(string *)local_130,local_b8,local_18);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  pSVar1 = q1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"exp2",&local_159);
  Model::createFlow<FlowExp>((Model *)pSVar1,(string *)local_158,local_18,local_58);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  pSVar1 = q1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"exp3",&local_181);
  Model::createFlow<FlowExp>((Model *)pSVar1,(string *)local_180,local_18,local_88);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  pSVar1 = q1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a8,"exp4",&local_1a9);
  Model::createFlow<FlowExp>((Model *)pSVar1,(string *)local_1a8,local_58,local_88);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  pSVar1 = q1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d0,"exp5",&local_1d1);
  Model::createFlow<FlowExp>((Model *)pSVar1,(string *)local_1d0,local_88,local_b8);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  pSVar1 = q1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"exp6",&local_1f9);
  Model::createFlow<FlowExp>((Model *)pSVar1,(string *)local_1f8,local_58,local_e8);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  (*(code *)**(undefined8 **)q1)(q1,0,100);
  dVar3 = (double)(**(code **)(*(long *)local_18 + 8))();
  if (0.0001 <= ABS(dVar3 - 31.8513)) {
    __assert_fail("fabs(q1->getValue() - 31.8513) < 0.0001",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mrlucasrib[P]MyVensim-Simulator/test/functional_tests/func_test.cpp"
                  ,0x2d,"void ultimateTest()");
  }
  dVar3 = (double)(**(code **)(*(long *)local_58 + 8))();
  if (0.0001 <= ABS(dVar3 - 18.4003)) {
    __assert_fail("fabs(q2->getValue() - 18.4003) < 0.0001",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mrlucasrib[P]MyVensim-Simulator/test/functional_tests/func_test.cpp"
                  ,0x2e,"void ultimateTest()");
  }
  dVar3 = (double)(**(code **)(*(long *)local_88 + 8))();
  if (0.0001 <= ABS(dVar3 - 77.1143)) {
    __assert_fail("fabs(q3->getValue() - 77.1143) < 0.0001",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mrlucasrib[P]MyVensim-Simulator/test/functional_tests/func_test.cpp"
                  ,0x2f,"void ultimateTest()");
  }
  dVar3 = (double)(**(code **)(*(long *)local_b8 + 8))();
  if (ABS(dVar3 - 56.1728) < 0.0001) {
    dVar3 = (double)(**(code **)(*(long *)local_e8 + 8))();
    if (ABS(dVar3 - 16.4612) < 0.0001) {
      return;
    }
    __assert_fail("fabs(q5->getValue() - 16.4612) < 0.0001",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mrlucasrib[P]MyVensim-Simulator/test/functional_tests/func_test.cpp"
                  ,0x31,"void ultimateTest()");
  }
  __assert_fail("fabs(q4->getValue() - 56.1728) < 0.0001",
                "/workspace/llm4binary/github/license_all_cmakelists_25/mrlucasrib[P]MyVensim-Simulator/test/functional_tests/func_test.cpp"
                ,0x30,"void ultimateTest()");
}

Assistant:

void ultimateTest(){
    auto *m = Model::createModel();
    auto *q1 = m->createSystem("sys1",100);
    auto *q2 = m->createSystem("sys2",0.0);
    auto *q3 = m->createSystem("sys3",100);
    auto *q4 = m->createSystem("sys4",0.0);
    auto *q5 = m->createSystem("sys5",0.0);
    m->createFlow<FlowExp>("exp1", q4, q1);
    m->createFlow<FlowExp>("exp2", q1, q2);
    m->createFlow<FlowExp>("exp3", q1, q3);
    m->createFlow<FlowExp>("exp4", q2, q3);
    m->createFlow<FlowExp>("exp5", q3, q4);
    m->createFlow<FlowExp>("exp6", q2, q5);


    m->execute(0, 100);

    assert(fabs(q1->getValue() - 31.8513) < 0.0001);
    assert(fabs(q2->getValue() - 18.4003) < 0.0001);
    assert(fabs(q3->getValue() - 77.1143) < 0.0001);
    assert(fabs(q4->getValue() - 56.1728) < 0.0001);
    assert(fabs(q5->getValue() - 16.4612) < 0.0001);

}